

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[2],char&,char_const(&)[2],kj::StringPtr_const&,char_const(&)[3],kj::String&>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1,
          char (*params_2) [2],StringPtr *params_3,char (*params_4) [3],String *params_5)

{
  char *pcVar1;
  ArrayPtr<const_char> *in_stack_ffffffffffffff70;
  undefined1 local_81 [9];
  size_t local_78;
  ArrayPtr<const_char> local_70;
  char *local_60;
  size_t local_58;
  kj *local_50;
  size_t local_48;
  ArrayPtr<const_char> local_40;
  
  local_48 = strlen((char *)this);
  local_81[0] = (*params)[0];
  local_50 = this;
  local_58 = strlen(params_1);
  local_70.ptr = *(char **)params_2;
  local_70.size_ = *(long *)(params_2 + 4) - 1;
  local_60 = params_1;
  local_78 = strlen((char *)params_3);
  pcVar1 = *(char **)(params_4[2] + 2);
  local_40.ptr = pcVar1;
  if (pcVar1 != (char *)0x0) {
    local_40.ptr = *(char **)params_4;
  }
  local_40.size_ = (size_t)(char *)0x0;
  if (pcVar1 != (char *)0x0) {
    local_40.size_ = (size_t)(pcVar1 + -1);
  }
  local_81._1_8_ = params_3;
  _::
  concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_50,(ArrayPtr<const_char> *)local_81,
             (FixedArray<char,_1UL> *)&local_60,&local_70,(ArrayPtr<const_char> *)(local_81 + 1),
             &local_40,in_stack_ffffffffffffff70);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}